

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O1

void test_char_dimensions(wins *wins_ar,int ar_len)

{
  long *plVar1;
  undefined4 uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  char the_char;
  int local_7c;
  long local_78;
  ulong local_70;
  ulong local_68;
  Am_Font_Family_Flag local_5c;
  Am_Font local_58 [8];
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_50 = (ulong)(uint)ar_len;
  local_38 = local_50 << 6;
  uVar4 = 0;
  local_70 = 0;
  local_7c = ar_len;
  do {
    lVar5 = 0;
    local_78 = 0;
    do {
      local_5c = test_font_variety::family_array[lVar5];
      local_78 = (long)(int)local_78;
      lVar3 = 0;
      local_48 = lVar5;
      do {
        local_68 = uVar4;
        local_40 = lVar3;
        Am_Font::Am_Font(local_58,local_5c,false,(int)local_70 != 0,false,
                         test_char_dimensions::size_array[lVar3]);
        Am_Font::operator=((Am_Font *)&test_font,local_58);
        Am_Font::~Am_Font(local_58);
        the_char = "AbgXij8.-@`|"[local_78];
        test_str_len = 1;
        iVar6 = (int)local_68;
        test_string = &the_char;
        if (0 < local_7c) {
          lVar5 = 0;
          do {
            plVar1 = *(long **)((long)&wins_ar->font_win + lVar5);
            (**(code **)(*plVar1 + 0xd0))
                      (plVar1,&test_font,test_string,test_str_len,&test_string_width,
                       &test_string_ascent,&test_string_descent,&test_string_left_bearing,
                       &test_string_right_bearing);
            test_string_height = test_string_descent + test_string_ascent;
            uVar2 = (**(code **)(*plVar1 + 0xc0))(plVar1,&test_font,(int)the_char);
            (**(code **)(*plVar1 + 0x170))
                      (plVar1,&black,&the_char,1,&test_font,0xaf,local_68,0,&Am_No_Style,0);
            lVar3 = local_38;
            iVar6 = (int)local_68;
            (**(code **)(*plVar1 + 0x160))
                      (plVar1,&black,&Am_No_Style,0xaf,local_68 & 0xffffffff,uVar2,
                       test_string_height,0);
            lVar5 = lVar5 + 0x40;
          } while (lVar3 != lVar5);
        }
        local_78 = local_78 + 1;
        uVar4 = (ulong)(iVar6 + test_string_height + 4);
        lVar3 = local_40 + 1;
      } while (lVar3 != 3);
      lVar5 = local_48 + 1;
    } while (lVar5 != 3);
    iVar6 = (int)local_70;
    local_70 = (ulong)(iVar6 + 1);
  } while (iVar6 == 0);
  if (0 < local_7c) {
    lVar3 = local_50 << 6;
    lVar5 = 0;
    do {
      (**(code **)(**(long **)((long)&wins_ar->font_win + lVar5) + 0xa0))();
      lVar5 = lVar5 + 0x40;
    } while (lVar3 != lVar5);
  }
  return;
}

Assistant:

void
test_char_dimensions(wins *wins_ar, int ar_len)
{
  // Since family_array and size_array are static, they persists across
  // multiple invocations of the enclosing function.  They will not be
  // reinitialized when the function is invoked a second time.
  static Am_Font_Family_Flag family_array[3] = {Am_FONT_FIXED, Am_FONT_SERIF,
                                                Am_FONT_SANS_SERIF};
  static Am_Font_Size_Flag size_array[3] = {Am_FONT_SMALL, Am_FONT_MEDIUM,
                                            Am_FONT_VERY_LARGE};
  int n;
  int top = 0;
  static const char *char_list = "AbgXij8.-@`|";
  for (int ital = 0; ital < 2; ital++) {
    n = 0;
    for (int fam = 0; fam < 3; fam++) {
      for (int size = 0; size < 3; size++) {
        test_font =
            Am_Font(family_array[fam], false, ital, false, size_array[size]);
        char the_char = char_list[n++];
        test_string = &the_char;
        test_str_len = 1;
        for (int i = 0; i < ar_len; i++) {
          Am_Drawonable *font_win = wins_ar[i].font_win;
          update_font_numbers(font_win); // To get test_string_height
          int char_width = font_win->Get_Char_Width(test_font, the_char);
          font_win->Draw_Text(black, &the_char, 1, test_font, 175, top);
          font_win->Draw_Rectangle(black, Am_No_Style, 175, top, char_width,
                                   test_string_height);
        }
        top = top + test_string_height + 4;
      }
    }
  }
  for (int i = 0; i < ar_len; i++) {
    (wins_ar[i].font_win)->Flush_Output();
  }
}